

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_document_add_scalar
              (yaml_document_t *document,yaml_char_t *tag,yaml_char_t *value,int length,
              yaml_scalar_style_t style)

{
  yaml_node_t *__dest;
  int iVar1;
  size_t sVar2;
  undefined4 local_c0 [2];
  yaml_node_t node;
  yaml_char_t *value_copy;
  yaml_char_t *tag_copy;
  yaml_mark_t mark;
  anon_struct_4_1_a7dec128 context;
  yaml_scalar_style_t style_local;
  int length_local;
  yaml_char_t *value_local;
  yaml_char_t *tag_local;
  yaml_document_t *document_local;
  
  memset(&tag_copy,0,0x18);
  value_copy = (yaml_char_t *)0x0;
  node.end_mark.column = 0;
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x4b7,
                  "int yaml_document_add_scalar(yaml_document_t *, yaml_char_t *, yaml_char_t *, int, yaml_scalar_style_t)"
                 );
  }
  if (value != (yaml_char_t *)0x0) {
    value_local = tag;
    if (tag == (yaml_char_t *)0x0) {
      value_local = "tag:yaml.org,2002:str";
    }
    sVar2 = strlen((char *)value_local);
    iVar1 = yaml_check_utf8(value_local,sVar2);
    if ((iVar1 != 0) && (value_copy = yaml_strdup(value_local), value_copy != (yaml_char_t *)0x0)) {
      context.error = length;
      if (length < 0) {
        sVar2 = strlen((char *)value);
        context.error = (yaml_error_type_t)sVar2;
      }
      iVar1 = yaml_check_utf8(value,(long)(int)context.error);
      if ((iVar1 != 0) &&
         (node.end_mark.column = (size_t)yaml_malloc((long)(int)(context.error + YAML_MEMORY_ERROR))
         , (void *)node.end_mark.column != (void *)0x0)) {
        memcpy((void *)node.end_mark.column,value,(long)(int)context.error);
        *(undefined1 *)(node.end_mark.column + (long)(int)context.error) = 0;
        memset(local_c0,0,0x60);
        local_c0[0] = 1;
        node.data._24_8_ = tag_copy;
        node.start_mark.index = mark.index;
        node.start_mark.line = mark.line;
        node.start_mark.column = (size_t)tag_copy;
        node.end_mark.index = mark.index;
        node.end_mark.line = mark.line;
        node.tag = (yaml_char_t *)node.end_mark.column;
        node.data.scalar.value = (yaml_char_t *)(long)(int)context.error;
        node._0_8_ = value_copy;
        node.data.scalar.length._0_4_ = style;
        if (((document->nodes).top != (document->nodes).end) ||
           (iVar1 = yaml_stack_extend((void **)document,&(document->nodes).top,
                                      &(document->nodes).end), iVar1 != 0)) {
          __dest = (document->nodes).top;
          (document->nodes).top = __dest + 1;
          memcpy(__dest,local_c0,0x60);
          return (int)(((long)(document->nodes).top - (long)(document->nodes).start) / 0x60);
        }
        mark.column._4_4_ = 1;
      }
    }
    yaml_free(value_copy);
    yaml_free((void *)node.end_mark.column);
    return 0;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0x4b8,
                "int yaml_document_add_scalar(yaml_document_t *, yaml_char_t *, yaml_char_t *, int, yaml_scalar_style_t)"
               );
}

Assistant:

YAML_DECLARE(int)
yaml_document_add_scalar(yaml_document_t *document,
        yaml_char_t *tag, yaml_char_t *value, int length,
        yaml_scalar_style_t style)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *tag_copy = NULL;
    yaml_char_t *value_copy = NULL;
    yaml_node_t node;

    assert(document);   /* Non-NULL document object is expected. */
    assert(value);      /* Non-NULL value is expected. */

    if (!tag) {
        tag = (yaml_char_t *)YAML_DEFAULT_SCALAR_TAG;
    }

    if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
    tag_copy = yaml_strdup(tag);
    if (!tag_copy) goto error;

    if (length < 0) {
        length = strlen((char *)value);
    }

    if (!yaml_check_utf8(value, length)) goto error;
    value_copy = YAML_MALLOC(length+1);
    if (!value_copy) goto error;
    memcpy(value_copy, value, length);
    value_copy[length] = '\0';

    SCALAR_NODE_INIT(node, tag_copy, value_copy, length, style, mark, mark);
    if (!PUSH(&context, document->nodes, node)) goto error;

    return document->nodes.top - document->nodes.start;

error:
    yaml_free(tag_copy);
    yaml_free(value_copy);

    return 0;
}